

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
fmt::v9::to_string<char,500ul>(basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf)

{
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  buffer<char> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t size;
  allocator local_4d [13];
  string local_40 [32];
  size_t local_20;
  buffer<char> *local_18;
  undefined1 local_1;
  
  local_18 = in_RSI;
  sVar1 = detail::buffer<char>::size(in_RSI);
  local_20 = sVar1;
  std::__cxx11::string::string(local_40);
  uVar2 = std::__cxx11::string::max_size();
  local_1 = sVar1 < uVar2;
  std::__cxx11::string::~string(local_40);
  pcVar3 = detail::buffer<char>::data(local_18);
  sVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar3,sVar1,local_4d);
  std::allocator<char>::~allocator((allocator<char> *)local_4d);
  return in_RDI;
}

Assistant:

FMT_NODISCARD auto to_string(const basic_memory_buffer<Char, SIZE>& buf)
    -> std::basic_string<Char> {
  auto size = buf.size();
  detail::assume(size < std::basic_string<Char>().max_size());
  return std::basic_string<Char>(buf.data(), size);
}